

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

timer_type * __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::make_exec_list(timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                 *this)

{
  timer_type *ptVar1;
  timer_type *wheel_timer;
  timer_type *ptVar2;
  timer_type *ptVar3;
  
  wheel_timer = (this->m_wheel).
                super__Vector_base<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_current_position].m_head;
  if (wheel_timer == (timer_type *)0x0) {
    ptVar3 = (timer_type *)0x0;
  }
  else {
    ptVar3 = (timer_type *)0x0;
    ptVar1 = (timer_type *)0x0;
    do {
      if (wheel_timer->m_full_rolls_left == 0) {
        ptVar2 = wheel_timer->m_next;
        remove_timer_from_wheel(this,wheel_timer);
        LOCK();
        *(undefined4 *)&(wheel_timer->super_timer_object<timertt::thread_safety::safe>).field_0xc =
             2;
        UNLOCK();
        if (ptVar3 == (timer_type *)0x0) {
          wheel_timer->m_prev = (timer_type *)0x0;
          wheel_timer->m_next = (timer_type *)0x0;
          ptVar3 = wheel_timer;
        }
        else {
          ptVar1->m_next = wheel_timer;
          wheel_timer->m_prev = ptVar1;
          wheel_timer->m_next = (timer_type *)0x0;
        }
      }
      else {
        wheel_timer->m_full_rolls_left = wheel_timer->m_full_rolls_left - 1;
        ptVar2 = wheel_timer->m_next;
        wheel_timer = ptVar1;
      }
      ptVar1 = wheel_timer;
      wheel_timer = ptVar2;
    } while (ptVar2 != (timer_type *)0x0);
  }
  return ptVar3;
}

Assistant:

timer_type *
	make_exec_list()
	{
		timer_type * head = nullptr;
		timer_type * tail = nullptr;

		timer_type * timer = m_wheel[ m_current_position ].m_head;
		while( timer )
		{
			if( timer->m_full_rolls_left )
			{
				timer->m_full_rolls_left -= 1;
				timer = timer->m_next;
			}
			else
			{
				timer_type * t = timer;
				timer = timer->m_next;

				remove_timer_from_wheel( t );
				t->m_status = timer_status::wait_for_execution;

				if( head )
				{
					tail->m_next = t;
					t->m_prev = tail;
					t->m_next = nullptr;
					tail = t;
				}
				else
				{
					head = tail = t;
					t->m_prev = t->m_next = nullptr;
				}
			}
		}

		return head;
	}